

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O2

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* dgrminer::find_maximal_subsets
            (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *__return_storage_ptr__,
            vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
            *sets)

{
  pointer pvVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  pointer pvVar5;
  _Base_ptr p_Var6;
  pointer psVar7;
  ulong uVar8;
  ulong uVar9;
  size_t i;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  __i;
  long lVar15;
  pointer pvVar16;
  ulong uVar17;
  _Self __tmp;
  ulong uVar18;
  ulong uVar19;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  vectors;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  newbucked;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  buckets;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  output;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  bucket;
  vector<int,_std::allocator<int>_> currentSet;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  testBucket;
  vector<int,_std::allocator<int>_> testSet;
  
  output.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  output.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  output.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets.
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buckets.
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  buckets.
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vectors.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vectors.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vectors.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar9 = 0;
      pvVar5 = vectors.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      pvVar1 = vectors.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      psVar7 = (sets->
               super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar9 < (ulong)(((long)(sets->
                             super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)psVar7) / 0x30);
      uVar9 = uVar9 + 1) {
    bucket.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bucket.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bucket.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    p_Var6 = *(_Base_ptr *)((long)&psVar7[uVar9]._M_t._M_impl.super__Rb_tree_header + 0x10);
    while (p_Var6 != &psVar7[uVar9]._M_t._M_impl.super__Rb_tree_header._M_header) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&bucket,(value_type_conflict1 *)(p_Var6 + 1));
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      psVar7 = (sets->
               super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&vectors,(value_type *)&bucket);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&bucket);
  }
  lVar15 = (long)vectors.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vectors.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = lVar15 / 0x18;
  if (uVar9 < 2) {
    (__return_storage_ptr__->
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         vectors.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         vectors.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         vectors.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    vectors.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vectors.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vectors.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    if (vectors.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        vectors.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar2 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dgrminer::find_maximal_subsets(std::vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>)::__0>>
                (vectors.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 vectors.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar15 < 0x181) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<dgrminer::find_maximal_subsets(std::vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>)::__0>>
                  (pvVar1,pvVar5);
      }
      else {
        pvVar16 = pvVar1 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<dgrminer::find_maximal_subsets(std::vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>)::__0>>
                  (pvVar1,pvVar16);
        for (; pvVar16 != pvVar5; pvVar16 = pvVar16 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Val_comp_iter<dgrminer::find_maximal_subsets(std::vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>)::__0>>
                    (pvVar16);
        }
      }
    }
    uVar17 = (ulong)((long)((vectors.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)((vectors.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    bucket.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bucket.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bucket.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar15 = 0;
    for (uVar9 = 0;
        uVar9 < (ulong)(((long)vectors.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)vectors.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar9 = uVar9 + 1)
    {
      uVar19 = *(long *)((long)&((vectors.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish + lVar15) -
               *(long *)((long)&((vectors.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar15) >> 2;
      if (uVar19 == (long)(int)uVar17) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::push_back(&bucket,(value_type *)
                            ((long)&((vectors.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_start + lVar15));
      }
      else {
        std::
        vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
        ::push_back(&buckets,&bucket);
        newbucked.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        newbucked.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        newbucked.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator=(&bucket,&newbucked);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::push_back(&bucket,(value_type *)
                            ((long)&((vectors.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_start + lVar15));
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(&newbucked);
        uVar17 = uVar19 & 0xffffffff;
      }
      lVar15 = lVar15 + 0x18;
    }
    std::
    vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
    ::push_back(&buckets,&bucket);
    lVar15 = 0;
    for (uVar9 = 0;
        pvVar1 = ((buckets.
                   super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar9 < (ulong)(((long)((buckets.
                                 super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18);
        uVar9 = uVar9 + 1) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(&output,(value_type *)
                          ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data + lVar15));
      lVar15 = lVar15 + 0x18;
    }
    for (uVar9 = 1;
        uVar9 < (ulong)(((long)buckets.
                               super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)buckets.
                              super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar9 = uVar9 + 1)
    {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&newbucked,
               buckets.
               super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar9);
      uVar17 = 0;
LAB_0011b764:
      if (uVar17 < (ulong)(((long)newbucked.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)newbucked.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
        std::vector<int,_std::allocator<int>_>::vector
                  (&currentSet,
                   newbucked.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar17);
        if (currentSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish !=
            currentSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start) {
          bVar4 = true;
          uVar19 = 0;
LAB_0011b7b2:
          if (uVar19 != uVar9) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::vector(&testBucket,
                     buckets.
                     super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar19);
            uVar18 = 0;
            bVar3 = bVar4;
LAB_0011b7d4:
            bVar4 = bVar3;
            if (uVar18 < (ulong)(((long)testBucket.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)testBucket.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)
                         &testSet.super__Vector_base<int,_std::allocator<int>_>,
                         testBucket.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar18);
              uVar8 = (long)currentSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)currentSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2;
              uVar10 = (long)testSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)testSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2;
              uVar11 = 0;
              uVar12 = 0;
              uVar13 = 0;
LAB_0011b83d:
              do {
                if (uVar11 == uVar8) goto LAB_0011b878;
                uVar13 = (ulong)(int)uVar13;
                uVar14 = uVar13;
                if (uVar13 < uVar10) {
                  uVar14 = uVar10;
                }
                for (; uVar14 != uVar13; uVar13 = uVar13 + 1) {
                  if (currentSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar11] <
                      testSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar13]) goto LAB_0011b878;
                  if (currentSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar11] ==
                      testSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar13]) {
                    uVar12 = (ulong)((int)uVar12 + 1);
                    uVar11 = uVar11 + 1;
                    if (uVar8 != uVar12) goto LAB_0011b83d;
                    bVar4 = false;
                    goto LAB_0011b878;
                  }
                }
                uVar11 = uVar11 + 1;
                uVar13 = uVar14;
              } while( true );
            }
            goto LAB_0011b895;
          }
          goto LAB_0011b8af;
        }
        goto LAB_0011b8d2;
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&newbucked);
    }
    (__return_storage_ptr__->
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         output.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         output.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         output.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    output.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    output.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    output.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&bucket);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&vectors);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector(&buckets);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&output);
  return __return_storage_ptr__;
LAB_0011b878:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&testSet.super__Vector_base<int,_std::allocator<int>_>);
  uVar18 = uVar18 + 1;
  bVar3 = bVar4;
  if (!bVar4) goto code_r0x0011b88d;
  goto LAB_0011b7d4;
code_r0x0011b88d:
  bVar3 = false;
LAB_0011b895:
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&testBucket);
  uVar19 = uVar19 + 1;
  if (!bVar3) goto LAB_0011b8af;
  goto LAB_0011b7b2;
LAB_0011b8af:
  if (bVar4) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&output,&currentSet);
  }
LAB_0011b8d2:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&currentSet.super__Vector_base<int,_std::allocator<int>_>);
  uVar17 = uVar17 + 1;
  goto LAB_0011b764;
}

Assistant:

std::vector<std::vector<int>> find_maximal_subsets(std::vector<std::set<int>> sets)
    {
        std::vector<std::vector<int>> output;
        std::vector<std::vector<std::vector<int>>> buckets;

        // transform sets into vectors:
        std::vector<std::vector<int>> vectors;
        for (size_t i = 0; i < sets.size(); i++)
        {
            std::vector<int> vec;
            for (std::set<int>::iterator j = sets[i].begin(); j != sets[i].end(); j++)
            {
                vec.push_back(*j);
            }
            vectors.push_back(vec);
        }


        if (vectors.size() <= 1)
        { return vectors; }

        // sort the vector by descending length
        std::sort(vectors.begin(), vectors.end(),
                  [](std::vector<int> x, std::vector<int> y) -> int { return (x.size() > y.size()); });


        int length = vectors[0].size();
        std::vector<std::vector<int>> bucket;//current bucket
        //Place each set with shared length in its own bucket
        for (size_t i = 0; i < vectors.size(); i++)
        {
            if (vectors[i].size() == length)//current Bucket
            {
                bucket.push_back(vectors[i]);
            }
            else//new Bucket
            {
                length = vectors[i].size();
                buckets.push_back(bucket);
                std::vector<std::vector<int>> newbucked;
                bucket = newbucked;
                bucket.push_back(vectors[i]);
            }
        }
        buckets.push_back(bucket);

        //Based on the assumption of uniqueness, everything in the first bucket is
        //larger than every other set and since it is unique, they are not proper subsets
        for (size_t i = 0; i < buckets[0].size(); i++)
        {
            output.push_back(buckets[0][i]);
        }

        //Iterate through the buckets
        for (int i = 1; i < buckets.size(); i++)
        {
            std::vector<std::vector<int>> currentBucket = buckets[i];

            //Iterate through the sets in the current bucket
            for (int a = 0; a < currentBucket.size(); a++)
            {
                std::vector<int> currentSet = currentBucket[a]; // this set can be potentially added

                //cout << "CURRENT SET: " << endl;
                //debug_output_vector(currentSet);

                // if the current set is empty and we got here, then there is another set which is a superset of this empty set
                if (currentSet.size() == 0)
                { continue; }

                bool addSet = true;

                //Iterate through buckets with greater length
                for (int b = 0; b < i; b++)
                {
                    std::vector<std::vector<int>> testBucket = buckets[b]; // here can be potentially a super set of the currentSet


                    //Iterate through the sets in testBucket
                    for (int c = 0; c < testBucket.size(); c++)
                    {
                        std::vector<int> testSet = testBucket[c]; // this can be potentially a super set of the currentSet
                        int testMatches = 0;

                        bool setClear = false; // my addition
                        int testIndex = 0;
                        //Iterate through the values in the current set
                        for (int d = 0; d < currentSet.size(); d++)
                        {

                            //Iterate through the values in the test set
                            for (; testIndex < testSet.size(); testIndex++)
                            {
                                if (currentSet[d] < testSet[testIndex])
                                {
                                    setClear = true;
                                    break;
                                }
                                if (currentSet[d] == testSet[testIndex])
                                {
                                    testMatches++;
                                    //cout << "MATCHES: " << testMatches << " ON d = " << d << " AND testIndex = " << testIndex << endl;
                                    if (testMatches == currentSet.size())
                                    {
                                        //cout << "SAME LENGTH" << endl;
                                        addSet = false;
                                        setClear = true;
                                    }
                                    break;
                                }
                            }//testIndex
                            if (setClear)
                            { break; }
                        }//d
                        if (!addSet)
                        { break; }
                    }//c
                    if (!addSet)
                    { break; }
                }//b
                if (addSet)
                { output.push_back(currentSet); }
            }//a
        }//i

        return output;
    }